

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

void Abc_ConvertAigToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x3a7,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 4) {
    return;
  }
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  uVar10 = 0xffffffff;
  uVar12 = 0xffffffff;
  puVar5 = (uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if (puVar5 != (uint *)0x0) {
    uVar12 = *puVar5;
    if ((int)uVar12 < 0) goto LAB_00861870;
    uVar12 = uVar12 ^ (uint)pObj->pFanin0 & 1;
  }
  puVar5 = (uint *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  if (puVar5 != (uint *)0x0) {
    uVar10 = *puVar5;
    if ((int)uVar10 < 0) {
LAB_00861870:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar10 = uVar10 ^ (uint)pObj->pFanin1 & 1;
  }
  if (p->fGiaSimple == 0) {
    uVar3 = uVar12;
    if ((int)uVar12 < 2) {
      uVar3 = uVar10;
      if (uVar12 == 0) {
        uVar3 = uVar12;
      }
      goto LAB_008617a4;
    }
    if ((int)uVar10 < 2) {
      if (uVar10 == 0) {
        uVar3 = uVar10;
      }
      goto LAB_008617a4;
    }
    if ((uVar12 == uVar10) || (uVar3 = 0, (uVar10 ^ uVar12) == 1)) goto LAB_008617a4;
    pFanout = Gia_ManAppendObj(p);
  }
  else {
    pFanout = Gia_ManAppendObj(p);
    if ((int)uVar12 < 0) goto LAB_00861851;
  }
  uVar4 = uVar12 >> 1;
  uVar3 = p->nObjs;
  if ((int)uVar3 <= (int)uVar4) {
LAB_00861851:
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if (((int)uVar10 < 0) || (uVar2 = uVar10 >> 1, uVar3 <= uVar2)) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar4 == uVar2) && (p->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  pGVar1 = p->pObjs;
  iVar6 = (int)pFanout;
  if (uVar12 < uVar10) {
    if (pGVar1 + uVar3 <= pFanout || pFanout < pGVar1) goto LAB_008617f4;
    uVar11 = *(ulong *)pFanout;
    uVar7 = (ulong)((uVar12 & 1) << 0x1d |
                   ((uint)(iVar6 - (int)pGVar1) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
    *(ulong *)pFanout = uVar7 | uVar11 & 0xffffffffc0000000;
    pGVar1 = p->pObjs;
    if ((pFanout < pGVar1) || (pGVar1 + p->nObjs <= pFanout)) goto LAB_008617f4;
    uVar11 = (ulong)(uVar10 & 1) << 0x3d |
             uVar7 | uVar11 & 0xc0000000c0000000 |
             (ulong)(((uint)(iVar6 - (int)pGVar1) >> 2) * -0x55555555 - uVar2 & 0x1fffffff) << 0x20;
  }
  else {
    if (pGVar1 + uVar3 <= pFanout || pFanout < pGVar1) goto LAB_008617f4;
    uVar11 = *(ulong *)pFanout;
    uVar7 = (ulong)(((uint)(iVar6 - (int)pGVar1) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) << 0x20;
    uVar8 = (ulong)(uVar12 & 1) << 0x3d;
    *(ulong *)pFanout = uVar8 | uVar11 & 0xc0000000ffffffff | uVar7;
    pGVar1 = p->pObjs;
    if ((pFanout < pGVar1) || (pGVar1 + p->nObjs <= pFanout)) goto LAB_008617f4;
    uVar11 = (ulong)((uVar10 & 1) << 0x1d) | uVar8 | uVar11 & 0xc0000000c0000000 | uVar7 |
             (ulong)(((uint)(iVar6 - (int)pGVar1) >> 2) * -0x55555555 - uVar2 & 0x1fffffff);
  }
  *(ulong *)pFanout = uVar11;
  if (p->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p,pFanout + -(uVar11 & 0x1fffffff),pFanout);
    Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout);
  }
  if (p->fSweeper != 0) {
    uVar7 = *(ulong *)pFanout & 0x1fffffff;
    uVar11 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
    uVar8 = 0x4000000000000000;
    uVar9 = 0x4000000000000000;
    if (((uint)*(ulong *)(pFanout + -uVar7) >> 0x1e & 1) == 0) {
      uVar9 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar7) = uVar9 | *(ulong *)(pFanout + -uVar7);
    uVar9 = *(ulong *)(pFanout + -uVar11);
    if (((uint)uVar9 >> 0x1e & 1) == 0) {
      uVar8 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar11) = uVar8 | uVar9;
    uVar11 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar11 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar11 >> 0x3d) ^ (uint)(uVar9 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -uVar7) >> 0x3f) ^
                (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
  }
  if (p->fBuiltInSim != 0) {
    uVar11 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar11 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar11 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pFanout + -(uVar11 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar11 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
    pGVar1 = p->pObjs;
    if ((pFanout < pGVar1) || (pGVar1 + p->nObjs <= pFanout)) goto LAB_008617f4;
    Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pFanout - (long)pGVar1) >> 2) * -0x55555555);
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(p,pFanout);
  }
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pFanout) && (pFanout < pGVar1 + p->nObjs)) {
    uVar3 = (int)((ulong)((long)pFanout - (long)pGVar1) >> 2) * 0x55555556;
LAB_008617a4:
    (pObj->field_0).iData = uVar3;
    if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
      *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
      return;
    }
    __assert_fail("!Hop_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x3ad,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
LAB_008617f4:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Abc_ConvertAigToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd2( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}